

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O2

void test_new_elimination_order(string *name,ArrayIDIDFunc *order)

{
  int __val;
  char *__dest;
  unsigned_long_long uVar1;
  ulong __n;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ArrayIDFunc<int> parent;
  
  if ((order->super_ArrayIDFunc<int>).preimage_count_ == 0) {
    if (!print_verbose_status) {
      return;
    }
    std::operator+(&local_f8,name," was aborted after ");
    uVar1 = get_milli_time();
    std::__cxx11::to_string(&local_118,uVar1 - program_start_milli_time);
    std::operator+(&local_d8,&local_f8,&local_118);
    std::operator+(&msg,&local_d8,"\n");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    write(2,msg._M_dataplus._M_p,msg._M_string_length);
    std::__cxx11::string::~string((string *)&msg);
    return;
  }
  compute_parent_array_from_elimination_order((ArrayIDIDFunc *)&parent,&tail,&head);
  __val = compute_tree_depth_of_parent_array(&parent);
  if (__val < best_tree_depth) {
    format_parent_array_abi_cxx11_(&msg,&parent,__val);
    __n = msg._M_string_length + 1;
    __dest = (char *)operator_new__(__n);
    memcpy(__dest,msg._M_dataplus._M_p,__n);
    std::__cxx11::string::~string((string *)&msg);
    if (best_tree_depth <= __val) {
      operator_delete__(__dest);
      goto LAB_0012c062;
    }
    if (best_decomposition != (char *)0x0) {
      operator_delete__(best_decomposition);
    }
    best_tree_depth = __val;
    best_decomposition = __dest;
    if (print_status != true) goto LAB_0012c062;
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_78,"depth ",&local_98);
    std::operator+(&local_58,&local_78," found after ");
    uVar1 = get_milli_time();
    std::__cxx11::to_string(&local_b8,uVar1 - program_start_milli_time);
    std::operator+(&local_118,&local_58,&local_b8);
    std::operator+(&local_f8,&local_118," ms by ");
    std::operator+(&local_d8,&local_f8,name);
    std::operator+(&msg,&local_d8,"\n");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    write(2,msg._M_dataplus._M_p,msg._M_string_length);
  }
  else {
    if (print_verbose_status != true) goto LAB_0012c062;
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_78,"not better depth ",&local_98);
    std::operator+(&local_58,&local_78," found after ");
    uVar1 = get_milli_time();
    std::__cxx11::to_string(&local_b8,uVar1 - program_start_milli_time);
    std::operator+(&local_118,&local_58,&local_b8);
    std::operator+(&local_f8,&local_118," ms by ");
    std::operator+(&local_d8,&local_f8,name);
    std::operator+(&msg,&local_d8,"\n");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    write(2,msg._M_dataplus._M_p,msg._M_string_length);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_0012c062:
  ArrayIDFunc<int>::~ArrayIDFunc(&parent);
  return;
}

Assistant:

void test_new_elimination_order(std::string name, const ArrayIDIDFunc& order)
{
    if(order.preimage_count() == 0){
        if (print_verbose_status) {
            string msg = name+" was aborted after " + to_string(get_milli_time() - program_start_milli_time) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
        return;
    }
    ArrayIDFunc<int> parent = compute_parent_array_from_elimination_order(tail, head, order);
    int depth = compute_tree_depth_of_parent_array(parent);
    if (depth < best_tree_depth) {
        char* new_decomposition;
        {
            std::string s = format_parent_array(parent, depth);
            new_decomposition = new char[s.length() + 1];
            memcpy(new_decomposition, s.c_str(), s.length() + 1);
        }
#ifdef PARALLELIZE
#pragma omp critical
#endif
        {
            if (depth < best_tree_depth) {
                delete[] best_decomposition;
                best_decomposition = new_decomposition;
                new_decomposition = nullptr;
                best_tree_depth = depth;
                if (print_status) {
                    string msg = "depth " + to_string(best_tree_depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
                    ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
                }
            }
        }
        delete[] new_decomposition;
    }else{
        if (print_verbose_status) {
            string msg = "not better depth " + to_string(depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
    }
}